

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O1

DdNode * Extra_bddSpaceFromMatrixNeg(DdManager *dd,DdNode *zA)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraBddSpaceFromMatrixNeg(dd,zA);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_bddSpaceFromMatrixNeg( DdManager * dd, DdNode * zA )
{
    DdNode * bRes;
    do {
		dd->reordered = 0;
		bRes = extraBddSpaceFromMatrixNeg( dd, zA );
    } while (dd->reordered == 1);
    return bRes;
}